

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

void array_bitset_container_intersection
               (array_container_t *src_1,bitset_container_t *src_2,array_container_t *dst)

{
  _Bool _Var1;
  int *in_RDX;
  array_container_t *in_RSI;
  int *in_RDI;
  uint16_t key;
  int i;
  int32_t origcard;
  int32_t newcard;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (in_RDX[1] < *in_RDI) {
    array_container_grow(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  }
  iVar4 = 0;
  iVar3 = *in_RDI;
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    *(undefined2 *)(*(long *)(in_RDX + 2) + (long)iVar4 * 2) =
         *(undefined2 *)(*(long *)(in_RDI + 2) + (long)iVar2 * 2);
    _Var1 = bitset_container_contains
                      ((bitset_container_t *)CONCAT44(iVar4,iVar3),(uint16_t)((uint)iVar2 >> 0x10));
    iVar4 = (uint)_Var1 + iVar4;
  }
  *in_RDX = iVar4;
  return;
}

Assistant:

void array_bitset_container_intersection(const array_container_t *src_1,
                                         const bitset_container_t *src_2,
                                         array_container_t *dst) {
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    int32_t newcard = 0;  // dst could be src_1
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        // this branchless approach is much faster...
        dst->array[newcard] = key;
        newcard += bitset_container_contains(src_2, key);
        /**
         * we could do it this way instead...
         * if (bitset_container_contains(src_2, key)) {
         * dst->array[newcard++] = key;
         * }
         * but if the result is unpredictible, the processor generates
         * many mispredicted branches.
         * Difference can be huge (from 3 cycles when predictible all the way
         * to 16 cycles when unpredictible.
         * See
         * https://github.com/lemire/Code-used-on-Daniel-Lemire-s-blog/blob/master/extra/bitset/c/arraybitsetintersection.c
         */
    }
    dst->cardinality = newcard;
}